

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86inst.cpp
# Opt level: O0

Error asmjit::X86Inst::validate
                (uint32_t archType,uint32_t instId,uint32_t options,Operand_ *extraOp,
                Operand_ *opArray,uint32_t opCount)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  uint *in_RCX;
  long lVar6;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  uint *in_R8;
  uint in_R9D;
  bool bVar7;
  uint32_t size;
  uint32_t kAvx512Options;
  OSignature *oRef;
  OSignature *oChk;
  uint32_t r;
  bool localImmOutOfRange;
  uint32_t iCount;
  uint32_t j;
  bool globalImmOutOfRange;
  OSignature *oSigData;
  ISignature *iEnd;
  ISignature *iSig;
  CommonData *commonData;
  OSignature *tod;
  uint32_t k32AndMore;
  uint32_t immFlags;
  uint64_t immValue;
  uint32_t indexId;
  int64_t offset;
  uint32_t baseId;
  uint32_t indexType;
  uint32_t baseType;
  X86Mem *m;
  uint32_t regId;
  uint32_t regType;
  uint32_t regMask;
  uint32_t memFlags;
  uint32_t opFlags;
  Operand_ *op;
  X86Mem *memOp;
  uint32_t combinedRegMask;
  uint32_t combinedOpFlags;
  OSignature oSigTranslated [6];
  uint32_t kRepRepnz;
  uint32_t kLockXAcqRel;
  uint32_t iFlags;
  X86Inst *iData;
  X86ValidationData *vd;
  uint32_t archMask;
  uint32_t i;
  uint32_t refRegMask_1;
  uint32_t refMemFlags_1;
  uint32_t opMemFlags_1;
  uint32_t opFlags_2;
  uint32_t refRegMask;
  uint32_t refMemFlags;
  uint32_t opMemFlags;
  uint32_t opFlags_1;
  bool local_5eb;
  bool local_5ea;
  bool local_5d9;
  bool local_5ca;
  ulong local_5c8;
  bool local_5ac;
  uint local_58c;
  char local_585;
  uint local_584;
  uint local_580;
  char local_579;
  undefined1 *local_578;
  byte *local_570;
  byte *local_568;
  uint *local_560;
  uint *local_558;
  undefined4 local_550;
  uint local_54c;
  ulong local_548;
  uint local_53c;
  ulong local_538;
  uint local_52c;
  uint local_528;
  uint local_524;
  uint *local_520;
  uint local_514;
  uint local_510;
  uint local_50c;
  uint local_508;
  uint local_504;
  uint *local_500;
  uint *local_4f8;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  ushort uStackY_4e4;
  byte abStackY_4e1 [45];
  undefined4 local_4b4;
  undefined4 local_4b0;
  uint local_4ac;
  ulong *local_4a8;
  undefined1 *local_4a0;
  uint local_494;
  uint local_490;
  uint local_48c;
  uint *local_488;
  uint *local_480;
  uint local_474;
  Error local_468;
  ulong *local_3d0;
  uint *local_3b8;
  uint *local_3b0;
  uint *local_3a8;
  uint *local_3a0;
  uint *local_398;
  uint local_38c;
  uint local_388;
  uint local_384;
  uint *local_380;
  uint *local_378;
  uint *local_370;
  uint *local_368;
  uint *local_360;
  uint *local_358;
  uint *local_350;
  uint *local_348;
  ulong local_340;
  ulong local_338;
  uint *local_330;
  uint *local_328;
  uint *local_320;
  uint *local_318;
  uint *local_310;
  uint *local_308;
  uint *local_300;
  uint *local_2f8;
  uint *local_2f0;
  uint *local_2e8;
  uint *local_2e0;
  ulong *local_2d8;
  ulong *local_2d0;
  uint local_2c8;
  uint local_2c4;
  uint local_2c0;
  uint local_2bc;
  char *local_2b8;
  uint *local_2b0;
  uint *local_2a8;
  char local_299;
  uint local_298;
  uint local_294;
  uint local_290;
  uint local_28c;
  char *local_288;
  uint *local_280;
  uint *local_278;
  char local_26d;
  undefined4 local_26c;
  uint *local_268;
  uint *local_260;
  uint *local_258;
  undefined4 local_24c;
  uint *local_248;
  uint *local_240;
  undefined4 local_234;
  uint *local_230;
  uint *local_228;
  undefined4 local_21c;
  uint *local_218;
  uint *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdfc;
  uint *in_stack_fffffffffffffe00;
  
  if (in_EDI == 0 || 3 < in_EDI) {
    local_468 = 5;
  }
  else {
    if (in_EDI == 1) {
      local_4a0 = _x86ValidationData;
      local_494 = 1;
    }
    else {
      local_4a0 = _x64ValidationData;
      local_494 = 2;
    }
    if (in_ESI < 0x59c) {
      local_4a8 = (ulong *)(X86InstDB::instData + (ulong)in_ESI * 0xc);
      local_4ac = *(uint *)(X86InstDB::commonData +
                           (ulong)((uint)(*local_4a8 >> 0x16) & 0x3ff) * 0xc);
      local_4b0 = 0x30000;
      if ((in_EDX & 0x32000) != 0) {
        if ((in_EDX & 0x2000) != 0) {
          if ((local_4ac & 0x4000) == 0 && (in_EDX & 0x30000) == 0) {
            return 0x1c;
          }
          bVar7 = true;
          if (in_R9D != 0) {
            bVar7 = (*in_R8 & 7) != 2;
          }
          if (bVar7) {
            return 0x1c;
          }
        }
        if ((in_EDX & 0x30000) != 0) {
          local_5ac = (in_EDX & 0x2000) == 0 || (in_EDX & 0x30000) == 0x30000;
          if (local_5ac) {
            return 0x1b;
          }
          if ((in_EDX & 0x10000) != 0 && (local_4ac & 0x8000) == 0) {
            return 0x1d;
          }
          if ((in_EDX & 0x20000) != 0 && (local_4ac & 0x10000) == 0) {
            return 0x1e;
          }
        }
      }
      local_4b4 = 0xc000;
      if ((in_EDX & 0xc000) != 0) {
        if ((in_EDX & 0xc000) == 0xc000) {
          return 0x1b;
        }
        if ((in_EDX & 0x4000) != 0 && (local_4ac & 0x1000) == 0) {
          return 0x1f;
        }
        if ((in_EDX & 0x8000) != 0 && (local_4ac & 0x2000) == 0) {
          return 0x1f;
        }
      }
      local_4ec = 0;
      local_4f0 = 0;
      local_4f8 = (uint *)0x0;
      local_490 = 0;
      local_48c = in_R9D;
      local_488 = in_R8;
      local_480 = in_RCX;
      local_474 = in_EDX;
      local_3d0 = local_4a8;
      local_2d8 = local_4a8;
      while ((local_490 < local_48c &&
             (local_500 = local_488 + (ulong)local_490 * 4, local_3b0 = local_500,
             (*local_500 & 7) != 0))) {
        local_504 = 0;
        local_508 = 0;
        local_50c = 0;
        local_3b8 = local_500;
        switch(*local_500 & 7) {
        case 1:
          local_510 = *local_500 >> 3 & 0x1f;
          if (0x15 < local_510) {
            return 0x17;
          }
          local_504 = *(uint *)(_x86OpFlagFromRegType + (ulong)local_510 * 4);
          if (local_504 == 0) {
            return 0x17;
          }
          local_514 = local_500[1];
          local_3a8 = local_500;
          local_3a0 = local_500;
          local_398 = local_500;
          if (local_514 < 0x100) {
            if (0x1f < local_514) {
              return 0x19;
            }
            local_384 = local_514;
            if (0x1f < local_514) {
              DebugUtils::assertionFailed
                        ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                         (char *)in_stack_fffffffffffffdf0);
            }
            local_50c = 1 << ((byte)local_514 & 0x1f);
            if ((*(uint *)(local_4a0 + (ulong)local_510 * 4) & local_50c) == 0) {
              return 0x19;
            }
            local_4f0 = local_50c | local_4f0;
          }
          else {
            local_50c = 0xffffffff;
          }
          break;
        case 2:
          local_524 = *local_500 >> 3 & 0x1f;
          local_528 = *local_500 >> 8 & 0x1f;
          if (6 < (*local_500 >> 0x12 & 7)) {
            return 0x2b;
          }
          local_520 = local_500;
          local_4f8 = local_500;
          local_380 = local_500;
          local_378 = local_500;
          local_370 = local_500;
          local_368 = local_500;
          if (local_524 == 0) {
            if ((*local_500 >> 3 & 0x1f) == 0) {
              local_5c8 = *(ulong *)(local_500 + 2);
            }
            else {
              local_5c8 = (ulong)(int)local_500[2];
            }
            local_538 = local_5c8;
            local_348 = local_500;
            if ((local_494 == 1) &&
               (local_340 = local_5c8, (long)local_5c8 < -0x80000000 || 0x7fffffff < (long)local_5c8
               )) {
              local_338 = local_5c8;
              local_5ca = 0xffffffff < local_5c8;
              if (local_5ca) {
                return 0x26;
              }
            }
          }
          else {
            local_52c = local_500[3];
            if (((*local_500 & 0x8000) == 0) &&
               ((*(uint *)(local_4a0 + 0x80) & 1 << (sbyte)local_524) == 0)) {
              return 0x26;
            }
            local_360 = local_500;
            local_358 = local_500;
            if (local_52c < 0x100) {
              local_388 = local_52c;
              if (0x1f < local_52c) {
                DebugUtils::assertionFailed
                          ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                           (char *)in_stack_fffffffffffffdf0);
              }
              local_50c = 1 << ((byte)local_52c & 0x1f);
              local_4f0 = local_50c | local_4f0;
            }
            else {
              local_50c = 0xffffffff;
            }
            if ((local_528 == 0) && (local_350 = local_500, local_500[2] == 0)) {
              local_508 = 0x800;
            }
          }
          if (local_528 == 0) {
            local_504 = 0x10000;
          }
          else {
            if ((*(uint *)(local_4a0 + 0x84) & 1 << (sbyte)local_528) == 0) {
              return 0x26;
            }
            if (local_528 == 9) {
              local_504 = 0x20000;
              local_508 = local_508 | 0x11;
            }
            else if (local_528 == 10) {
              local_504 = 0x20000;
              local_508 = local_508 | 0x22;
            }
            else if (local_528 == 0xb) {
              local_504 = 0x20000;
              local_508 = local_508 | 0x44;
            }
            else {
              local_504 = 0x10000;
              if (local_524 != 0) {
                local_508 = local_508 | 0x4000;
              }
            }
            local_53c = local_500[1];
            local_330 = local_500;
            if (local_53c < 0x100) {
              local_38c = local_53c;
              if (0x1f < local_53c) {
                DebugUtils::assertionFailed
                          ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                           (char *)in_stack_fffffffffffffdf0);
              }
              local_4f0 = 1 << ((byte)local_53c & 0x1f) | local_4f0;
            }
            local_50c = 0;
          }
          local_320 = local_500;
          switch(*local_500 >> 0x18) {
          case 0:
            local_508 = local_508 | 0x8000;
            break;
          case 1:
            local_508 = local_508 | 1;
            break;
          case 2:
            local_508 = local_508 | 2;
            break;
          default:
            return 0x2d;
          case 4:
            local_508 = local_508 | 4;
            break;
          case 6:
            local_508 = local_508 | 8;
            break;
          case 8:
            local_508 = local_508 | 0x10;
            break;
          case 10:
            local_508 = local_508 | 0x20;
            break;
          case 0x10:
            local_508 = local_508 | 0x40;
            break;
          case 0x20:
            local_508 = local_508 | 0x80;
            break;
          case 0x40:
            local_508 = local_508 | 0x100;
          }
          break;
        case 3:
          local_548 = *(ulong *)(local_500 + 2);
          if ((long)local_548 < 0) {
            local_548 = (local_548 ^ 0xffffffffffffffff) + 1;
            if (local_548 < 0x81) {
              local_54c = 0x2a80000;
            }
            else if (local_548 < 0x8001) {
              local_54c = 0x2a00000;
            }
            else if (local_548 < 0x80000001) {
              local_54c = 0x2800000;
            }
            else {
              local_54c = 0x2000000;
            }
          }
          else {
            local_550 = 0x7800000;
            if (local_548 < 0x10) {
              local_54c = 0x7fc0000;
            }
            else if (local_548 < 0x80) {
              local_54c = 0x7f80000;
            }
            else if (local_548 < 0x100) {
              local_54c = 0x7f00000;
            }
            else if (local_548 < 0x8000) {
              local_54c = 0x7e00000;
            }
            else if (local_548 < 0x10000) {
              local_54c = 0x7c00000;
            }
            else if (local_548 < 0x80000000) {
              local_54c = 0x7800000;
            }
            else if (local_548 < 0x100000000) {
              local_54c = 0x7000000;
            }
            else if (local_548 < 0x8000000000000000) {
              local_54c = 0x6000000;
            }
            else {
              local_54c = 0x4000000;
            }
          }
          local_504 = local_54c;
          local_318 = local_500;
          local_310 = local_500;
          break;
        case 4:
          local_504 = 0x18000000;
          break;
        default:
          return 4;
        }
        uVar3 = (ulong)local_490;
        local_558 = &local_4e8 + uVar3 * 2;
        *local_558 = local_504;
        (&uStackY_4e4)[uVar3 * 4] = (ushort)local_508;
        abStackY_4e1[uVar3 * 8] = (byte)local_50c;
        local_4ec = local_504 | local_4ec;
        local_490 = local_490 + 1;
      }
      if (local_490 < local_48c) {
        do {
          local_48c = local_48c - 1;
          if (local_48c <= local_490) goto LAB_0015dd02;
          local_2e8 = local_488 + (ulong)local_48c * 4;
          local_2e0 = local_2e8;
        } while ((*local_2e8 & 7) == 0);
        local_468 = 4;
      }
      else {
LAB_0015dd02:
        if (local_494 == 1) {
          if ((local_4ec & 0x10) != 0) {
            return 0x32;
          }
        }
        else {
          local_5d9 = (local_4ec & 2) != 0 && (local_4f0 & 0xffffff00) != 0;
          if (local_5d9) {
            return 0x31;
          }
        }
        local_2d0 = local_4a8;
        lVar6 = (ulong)((uint)(*local_4a8 >> 0x16) & 0x3ff) * 0xc;
        local_560 = (uint *)(X86InstDB::commonData + lVar6);
        local_568 = &X86InstDB::iSignatureData +
                    (long)(int)((uint)((ulong)*(undefined8 *)(X86InstDB::commonData + lVar6 + 4) >>
                                      0x28) & 0x3ff) * 8;
        local_570 = local_568 +
                    (long)(int)((uint)((ulong)*(undefined8 *)(X86InstDB::commonData + lVar6 + 4) >>
                                      0x32) & 0xf) * 8;
        if (local_568 != local_570) {
          local_578 = X86InstDB::oSignatureData;
          local_579 = '\0';
          do {
            if (((*local_568 >> 3 & 3) & local_494) != 0) {
              local_580 = 0;
              local_584 = (uint)(*local_568 & 7);
              local_585 = '\0';
              if (local_584 == local_48c) {
                for (local_580 = 0; local_580 < local_48c; local_580 = local_580 + 1) {
                  uVar3 = (ulong)local_580;
                  local_278 = &local_4e8 + uVar3 * 2;
                  lVar6 = (ulong)local_568[(ulong)local_580 + 2] * 8;
                  local_280 = (uint *)(X86InstDB::oSignatureData + lVar6);
                  local_288 = &local_585;
                  local_28c = *local_278;
                  if ((local_28c & *local_280) == 0) {
                    if (((local_28c & 0x7fc0000) == 0) || ((*local_280 & 0x7fc0000) == 0)) {
                      local_26d = '\0';
                    }
                    else {
                      local_585 = '\x01';
                      local_26d = '\x01';
                    }
                  }
                  else {
                    local_290 = (uint)(&uStackY_4e4)[uVar3 * 4];
                    if (local_290 == 0) {
LAB_0015e028:
                      if ((local_28c & 0x7fff) != 0) {
                        local_298 = (uint)(byte)X86InstDB::oSignatureData[lVar6 + 7];
                        if ((local_298 != 0) &&
                           ((abStackY_4e1[uVar3 * 8] & X86InstDB::oSignatureData[lVar6 + 7]) == 0))
                        {
                          local_26d = '\0';
                          goto LAB_0015e082;
                        }
                      }
                      local_26d = '\x01';
                    }
                    else {
                      uVar1 = *(ushort *)(X86InstDB::oSignatureData + lVar6 + 4);
                      local_294 = (uint)uVar1;
                      if ((uVar1 & (&uStackY_4e4)[uVar3 * 4]) == 0) {
                        local_26d = '\0';
                      }
                      else {
                        if (((uVar1 & 0x800) == 0) || (local_290 != 0)) goto LAB_0015e028;
                        local_26d = '\0';
                      }
                    }
                  }
LAB_0015e082:
                  if (local_26d == '\0') break;
                }
              }
              else if (local_584 - (*local_568 >> 5) == local_48c) {
                local_58c = 0;
                for (local_580 = 0; local_580 < local_48c && local_58c < local_584;
                    local_580 = local_580 + 1) {
                  uVar3 = (ulong)local_580;
                  puVar4 = &local_4e8 + uVar3 * 2;
                  while( true ) {
                    lVar6 = (long)(int)(uint)local_568[(ulong)local_58c + 2] * 8;
                    puVar5 = (uint *)(X86InstDB::oSignatureData + lVar6);
                    if ((*puVar5 & 0x80000000) == 0) break;
                    local_58c = local_58c + 1;
                    if (local_584 <= local_58c) goto LAB_0015e327;
                  }
                  local_2b8 = &local_585;
                  local_2bc = *puVar4;
                  if ((local_2bc & *puVar5) == 0) {
                    if (((local_2bc & 0x7fc0000) == 0) || ((*puVar5 & 0x7fc0000) == 0)) {
                      local_299 = '\0';
                    }
                    else {
                      local_585 = '\x01';
                      local_299 = '\x01';
                    }
                  }
                  else {
                    local_2c0 = (uint)(&uStackY_4e4)[uVar3 * 4];
                    if (local_2c0 == 0) {
LAB_0015e29a:
                      if ((local_2bc & 0x7fff) != 0) {
                        local_2c8 = (uint)(byte)X86InstDB::oSignatureData[lVar6 + 7];
                        if ((local_2c8 != 0) &&
                           ((abStackY_4e1[uVar3 * 8] & X86InstDB::oSignatureData[lVar6 + 7]) == 0))
                        {
                          local_299 = '\0';
                          goto LAB_0015e2f4;
                        }
                      }
                      local_299 = '\x01';
                    }
                    else {
                      uVar1 = *(ushort *)(X86InstDB::oSignatureData + lVar6 + 4);
                      local_2c4 = (uint)uVar1;
                      if ((uVar1 & (&uStackY_4e4)[uVar3 * 4]) == 0) {
                        local_299 = '\0';
                      }
                      else {
                        if (((uVar1 & 0x800) == 0) || (local_2c0 != 0)) goto LAB_0015e29a;
                        local_299 = '\0';
                      }
                    }
                  }
LAB_0015e2f4:
                  local_2b0 = puVar5;
                  local_2a8 = puVar4;
                  if (local_299 == '\0') break;
                  local_58c = local_58c + 1;
                }
              }
LAB_0015e327:
              if (local_580 == local_48c) {
                if (local_585 == '\0') {
                  local_579 = '\0';
                  break;
                }
                local_579 = local_585;
              }
            }
            local_568 = local_568 + 8;
          } while (local_568 != local_570);
          if (local_568 == local_570) {
            if (local_579 != '\0') {
              return 0x2c;
            }
            return 0x16;
          }
        }
        local_2f8 = local_480;
        local_2f0 = local_480;
        if (((*local_480 & 7) != 0) || ((local_474 & 0x9c0000) != 0)) {
          local_26c = 0x100000;
          if ((*local_560 & 0x100000) == 0) {
            if (((local_474 & 0x9c0000) != 0) || ((local_474 & 0xc000) == 0)) {
              return 0x16;
            }
          }
          else {
            local_308 = local_480;
            local_300 = local_480;
            if ((*local_480 & 7) != 0) {
              local_260 = local_480;
              if (*local_480 != 0x391) {
                return 0x21;
              }
              local_24c = 0x1000000;
              local_258 = local_560;
              local_248 = local_560;
              if ((*local_560 & 0x1000000) == 0) {
                return 0x22;
              }
            }
            if ((local_474 & 0x800000) != 0) {
              bVar7 = false;
              if ((local_474 & 0x800000) != 0) {
                local_234 = 0x2000000;
                bVar7 = (*local_560 & 0x2000000) == 0;
                local_240 = local_560;
                local_230 = local_560;
              }
              if (bVar7) {
                return 0x23;
              }
            }
            if ((local_474 & 0x100000) != 0) {
              if (local_4f8 == (uint *)0x0) {
                return 0x24;
              }
              local_328 = local_4f8;
              uVar2 = *local_4f8 >> 0x18;
              if (uVar2 != 0) {
                local_21c = 0x10000000;
                local_5ea = (*local_560 & 0x10000000) != 0 && uVar2 != 4;
                if (local_5ea) {
                  return 0x24;
                }
                in_stack_fffffffffffffdfc = 0x20000000;
                local_5eb = (*local_560 & 0x20000000) != 0 && uVar2 != 8;
                local_228 = local_560;
                local_218 = local_560;
                in_stack_fffffffffffffdf0 = local_560;
                in_stack_fffffffffffffe00 = local_560;
                if (local_5eb) {
                  return 0x24;
                }
              }
            }
            if ((local_474 & 0xc0000) != 0) {
              if (local_4f8 != (uint *)0x0) {
                return 0x25;
              }
              if ((local_474 & 0x40000) == 0) {
                if ((*local_560 & 0x8000000) == 0) {
                  return 0x25;
                }
              }
              else {
                if ((*local_560 & 0x4000000) == 0) {
                  return 0x25;
                }
                if ((*local_560 & 0x30000000) != 0) {
                  if (local_48c < 2) {
                    local_268 = local_560;
                    DebugUtils::assertionFailed
                              ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                               (char *)in_stack_fffffffffffffdf0);
                  }
                  bVar7 = false;
                  if (*local_488 != 0x40000159) {
                    bVar7 = local_488[4] != 0x40000159;
                  }
                  if (bVar7) {
                    return 0x25;
                  }
                }
              }
            }
          }
        }
        local_468 = 0;
      }
    }
    else {
      local_468 = 3;
    }
  }
  return local_468;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Inst::validate(
  uint32_t archType,
  uint32_t instId, uint32_t options,
  const Operand_& extraOp, const Operand_* opArray, uint32_t opCount) noexcept {

  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !opArray[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepnz) == kRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = opArray[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!opArray[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!X86Inst_checkOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iCount - iSig->implicit == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iCount)
              break;
            else
              goto Next;
          }

          if (!X86Inst_checkOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraOp.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraOp.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(!X86Reg::isK(extraOp)))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(opCount >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(opArray[0]) && !X86Reg::isZmm(opArray[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}